

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dreadrb.c
# Opt level: O2

int ReadVector(FILE *fp,int n,int_t *where,int perline,int persize)

{
  char cVar1;
  int iVar2;
  int_t *piVar3;
  long lVar4;
  char *__nptr;
  int iVar5;
  char buf [100];
  
  piVar3 = (int_t *)(long)n;
  for (iVar5 = 0; iVar5 < n; iVar5 = iVar5 + (int)lVar4) {
    fgets(buf,100,(FILE *)fp);
    piVar3 = where + iVar5;
    __nptr = buf;
    for (lVar4 = 0; (lVar4 < perline && (piVar3 = (int_t *)(iVar5 + lVar4), (long)piVar3 < (long)n))
        ; lVar4 = lVar4 + 1) {
      cVar1 = __nptr[persize];
      __nptr[persize] = '\0';
      iVar2 = atoi(__nptr);
      __nptr[persize] = cVar1;
      piVar3 = (int_t *)(ulong)(iVar2 - 1U);
      (where + iVar5)[lVar4] = iVar2 - 1U;
      __nptr = __nptr + persize;
    }
  }
  return (int)piVar3;
}

Assistant:

static int ReadVector(FILE *fp, int n, int_t *where, int perline, int persize)
{
    int_t i, j, item;
    char tmp, buf[100];

    i = 0;
    while (i < n) {
        fgets(buf, 100, fp);    /* read a line at a time */
        for (j=0; j<perline && i<n; j++) {
            tmp = buf[(j+1)*persize];     /* save the char at that place */
            buf[(j+1)*persize] = 0;       /* null terminate */
            item = atoi(&buf[j*persize]); 
            buf[(j+1)*persize] = tmp;     /* recover the char at that place */
            where[i++] = item - 1;
        }
    }

    return 0;
}